

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_mul_internal(mp_int *r,mp_int *a,mp_int *b,mp_int scratch)

{
  BignumInt *pBVar1;
  ulong *puVar2;
  ulong *puVar3;
  BignumInt *pBVar4;
  size_t sVar5;
  ulong *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong *puVar9;
  undefined1 auVar10 [16];
  size_t i_2;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  BignumInt BVar20;
  ulong uVar21;
  BignumInt *pBVar22;
  BignumInt BVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int scratch_02;
  mp_int scratch_03;
  mp_int asum;
  mp_int a1;
  mp_int bsum;
  mp_int b1;
  mp_int b0;
  mp_int r2;
  mp_int a0;
  mp_int product;
  mp_int r0;
  mp_int local_120;
  ulong local_110;
  BignumInt *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  BignumInt *local_e0;
  BignumInt *local_d8;
  BignumInt *local_d0;
  BignumInt *local_c8;
  ulong local_c0;
  ulong local_b8;
  mp_int local_b0;
  mp_int local_a0;
  mp_int local_90;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  pBVar22 = scratch.w;
  uVar13 = scratch.nw;
  uVar16 = b->nw;
  if (b->nw < a->nw) {
    uVar16 = a->nw;
  }
  uVar12 = r->nw;
  if (uVar12 < uVar16) {
    uVar16 = uVar12;
  }
  if (uVar13 < uVar16 * 6) {
    __assert_fail("scratch.nw >= mp_mul_scratchspace_unary(inlen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x3f7,"void mp_mul_internal(mp_int *, mp_int *, mp_int *, mp_int)");
  }
  smemclr(r->w,uVar12 << 3);
  if (((0x17 < uVar16) && (uVar12 = a->nw, uVar12 != 0)) && (uVar15 = b->nw, uVar15 != 0)) {
    local_110 = uVar16 >> 1;
    uVar25 = uVar16 - local_110;
    local_c0 = uVar25;
    if (uVar12 < uVar25) {
      local_c0 = uVar12;
    }
    local_d8 = a->w;
    local_f8 = uVar25;
    if (uVar15 < uVar25) {
      local_f8 = uVar15;
    }
    local_c8 = b->w;
    local_b8 = uVar12 - local_c0;
    if (local_110 <= uVar12 - local_c0) {
      local_b8 = local_110;
    }
    local_e0 = local_d8 + local_c0;
    local_f0 = uVar15 - local_f8;
    if (local_110 <= uVar15 - local_f8) {
      local_f0 = local_110;
    }
    local_d0 = local_c8 + local_f8;
    uVar15 = uVar25 * 2;
    uVar12 = r->nw;
    local_e8 = uVar15;
    if (uVar12 < uVar15) {
      local_e8 = uVar12;
    }
    uVar14 = uVar25;
    if (uVar12 < uVar25) {
      uVar14 = uVar12;
    }
    uVar19 = uVar12 - uVar14;
    if (uVar12 <= uVar12 - uVar14) {
      uVar19 = uVar12;
    }
    local_100 = uVar12 - local_e8;
    if (uVar12 <= uVar12 - local_e8) {
      local_100 = uVar12;
    }
    pBVar4 = r->w;
    local_108 = pBVar4 + local_e8;
    local_b0.nw = local_b8;
    local_b0.w = local_e0;
    local_90.nw = local_f0;
    local_90.w = local_d0;
    local_80.nw = local_f8;
    local_80.w = local_c8;
    local_70.nw = local_100;
    local_70.w = local_108;
    local_60.nw = local_c0;
    local_60.w = local_d8;
    local_40.nw = local_e8;
    local_40.w = pBVar4;
    mp_mul_internal(&local_40,&local_60,&local_80,scratch);
    mp_mul_internal(&local_70,&local_b0,&local_90,scratch);
    uVar12 = local_e8;
    if (r->nw < uVar16 * 2) {
      if (uVar19 <= uVar16) {
        uVar16 = uVar19;
      }
      if (uVar16 <= uVar13) {
        if (uVar13 - uVar16 < uVar13) {
          uVar13 = uVar13 - uVar16;
        }
        pBVar1 = pBVar22 + uVar16;
        scratch_00.w = pBVar1;
        scratch_00.nw = uVar13;
        local_120.nw = uVar16;
        local_120.w = pBVar22;
        mp_mul_internal(&local_120,&local_60,&local_90,scratch_00);
        if (uVar19 != 0) {
          uVar12 = 0;
          uVar15 = 0;
          do {
            if (uVar15 < uVar16) {
              uVar25 = pBVar22[uVar15];
            }
            else {
              uVar25 = 0;
            }
            uVar11 = uVar12 + pBVar4[uVar14 + uVar15];
            uVar12 = (ulong)CARRY8(uVar12,pBVar4[uVar14 + uVar15]) + (ulong)CARRY8(uVar11,uVar25);
            if (pBVar4 != (BignumInt *)0x0) {
              pBVar4[uVar14 + uVar15] = uVar11 + uVar25;
            }
            uVar15 = uVar15 + 1;
          } while (uVar19 != uVar15);
          scratch_01.w = pBVar1;
          scratch_01.nw = uVar13;
          mp_mul_internal(&local_120,&local_b0,&local_80,scratch_01);
          uVar13 = 0;
          uVar12 = 0;
          do {
            if (uVar12 < uVar16) {
              uVar15 = pBVar22[uVar12];
            }
            else {
              uVar15 = 0;
            }
            uVar25 = uVar13 + pBVar4[uVar14 + uVar12];
            uVar13 = (ulong)CARRY8(uVar13,pBVar4[uVar14 + uVar12]) + (ulong)CARRY8(uVar25,uVar15);
            if (pBVar4 != (BignumInt *)0x0) {
              pBVar4[uVar14 + uVar12] = uVar25 + uVar15;
            }
            uVar12 = uVar12 + 1;
          } while (uVar19 != uVar12);
          return;
        }
        scratch_03.w = pBVar1;
        scratch_03.nw = uVar13;
        mp_mul_internal(&local_120,&local_b0,&local_80,scratch_03);
        return;
      }
    }
    else {
      uVar27 = uVar25 + 1;
      uVar11 = uVar13 - uVar27;
      if ((uVar27 <= uVar13) && (local_120.nw = uVar27, local_120.w = pBVar22, uVar27 <= uVar11)) {
        if (uVar11 < uVar13) {
          uVar13 = uVar11;
        }
        uVar11 = uVar13 - uVar27;
        if (uVar13 <= uVar13 - uVar27) {
          uVar11 = uVar13;
        }
        local_a0.w = pBVar22 + uVar27;
        if (uVar27 != 0) {
          uVar18 = 0;
          uVar13 = 0;
          do {
            if (uVar13 < local_c0) {
              BVar20 = local_d8[uVar13];
            }
            else {
              BVar20 = 0;
            }
            if (uVar13 < local_b8) {
              BVar23 = local_e0[uVar13];
            }
            else {
              BVar23 = 0;
            }
            uVar21 = BVar20 + uVar18;
            uVar18 = (ulong)CARRY8(BVar20,uVar18) + (ulong)CARRY8(uVar21,BVar23);
            if (pBVar22 != (BignumInt *)0x0) {
              pBVar22[uVar13] = uVar21 + BVar23;
            }
            uVar13 = uVar13 + 1;
          } while (uVar27 != uVar13);
          uVar18 = 0;
          uVar13 = 0;
          do {
            if (uVar13 < local_f8) {
              BVar20 = local_c8[uVar13];
            }
            else {
              BVar20 = 0;
            }
            if (uVar13 < local_f0) {
              BVar23 = local_d0[uVar13];
            }
            else {
              BVar23 = 0;
            }
            uVar21 = BVar20 + uVar18;
            uVar18 = (ulong)CARRY8(BVar20,uVar18) + (ulong)CARRY8(uVar21,BVar23);
            local_a0.w[uVar13] = uVar21 + BVar23;
            uVar13 = uVar13 + 1;
          } while (uVar27 != uVar13);
        }
        local_a0.nw = uVar27;
        if (uVar15 < uVar11) {
          pBVar1 = local_a0.w + uVar27;
          local_50.nw = uVar15 | 1;
          uVar13 = uVar11 - local_50.nw;
          if (uVar11 <= uVar11 - local_50.nw) {
            uVar13 = uVar11;
          }
          scratch_02.w = pBVar1 + uVar25 * 2 + 1;
          scratch_02.nw = uVar13;
          local_50.w = pBVar1;
          mp_mul_internal(&local_50,&local_120,&local_a0,scratch_02);
          uVar25 = uVar16 * 2 + local_110 * -2 + 1;
          uVar16 = 1;
          uVar13 = 0;
          do {
            if (uVar15 < uVar13) {
              uVar11 = 0;
            }
            else {
              uVar11 = pBVar1[uVar13];
            }
            uVar27 = 0xffffffffffffffff;
            if (uVar13 < uVar12) {
              uVar27 = ~pBVar4[uVar13];
            }
            uVar18 = uVar11 + uVar16;
            uVar16 = (ulong)CARRY8(uVar11,uVar16) + (ulong)CARRY8(uVar18,uVar27);
            if (pBVar22 != (BignumInt *)0x0) {
              pBVar1[uVar13] = uVar18 + uVar27;
            }
            uVar13 = uVar13 + 1;
          } while (uVar25 != uVar13);
          uVar16 = 1;
          uVar13 = 0;
          do {
            if (uVar15 < uVar13) {
              uVar12 = 0;
            }
            else {
              uVar12 = pBVar1[uVar13];
            }
            uVar11 = 0xffffffffffffffff;
            if (uVar13 < local_100) {
              uVar11 = ~local_108[uVar13];
            }
            uVar27 = uVar12 + uVar16;
            uVar16 = (ulong)CARRY8(uVar12,uVar16) + (ulong)CARRY8(uVar27,uVar11);
            if (pBVar22 != (BignumInt *)0x0) {
              pBVar1[uVar13] = uVar27 + uVar11;
            }
            uVar13 = uVar13 + 1;
          } while (uVar25 != uVar13);
          if (uVar19 == 0) {
            return;
          }
          uVar13 = 0;
          uVar16 = 0;
          do {
            if (uVar15 < uVar16) {
              uVar12 = 0;
            }
            else {
              uVar12 = pBVar1[uVar16];
            }
            uVar25 = uVar13 + pBVar4[uVar14 + uVar16];
            uVar13 = (ulong)CARRY8(uVar13,pBVar4[uVar14 + uVar16]) + (ulong)CARRY8(uVar25,uVar12);
            if (pBVar4 != (BignumInt *)0x0) {
              pBVar4[uVar14 + uVar16] = uVar25 + uVar12;
            }
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
          return;
        }
      }
    }
    __assert_fail("len <= pool->nw",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
  }
  if (0 < (long)r->nw && 0 < (long)a->nw) {
    puVar17 = a->w;
    puVar2 = puVar17 + a->nw;
    sVar5 = b->nw;
    puVar6 = b->w;
    puVar24 = r->w;
    puVar3 = puVar24 + r->nw;
    do {
      puVar26 = puVar24;
      if ((long)sVar5 < 1) {
        uVar13 = 0;
      }
      else {
        uVar16 = *puVar17;
        uVar13 = 0;
        puVar9 = puVar6;
        do {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar16;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *puVar9;
          auVar10[8] = CARRY8(uVar13,*puVar26);
          auVar10._0_8_ = uVar13 + *puVar26;
          auVar10._9_7_ = 0;
          auVar10 = auVar7 * auVar8 + auVar10;
          *puVar26 = auVar10._0_8_;
          uVar13 = auVar10._8_8_;
          puVar26 = puVar26 + 1;
          if (puVar6 + sVar5 <= puVar9 + 1) break;
          puVar9 = puVar9 + 1;
        } while (puVar26 < puVar3);
      }
      for (; puVar26 < puVar3; puVar26 = puVar26 + 1) {
        uVar16 = *puVar26;
        *puVar26 = *puVar26 + uVar13;
        uVar13 = (ulong)CARRY8(uVar16,uVar13);
      }
      puVar17 = puVar17 + 1;
    } while ((puVar17 < puVar2) && (puVar24 = puVar24 + 1, puVar24 < puVar3));
  }
  return;
}

Assistant:

static void mp_mul_internal(mp_int *r, mp_int *a, mp_int *b, mp_int scratch)
{
    size_t inlen = size_t_min(r->nw, size_t_max(a->nw, b->nw));
    assert(scratch.nw >= mp_mul_scratchspace_unary(inlen));

    mp_clear(r);

    if (inlen < KARATSUBA_THRESHOLD || a->nw == 0 || b->nw == 0) {
        /*
         * The input numbers are too small to bother optimising. Go
         * straight to the simple primitive approach.
         */
        mp_mul_add_simple(r, a, b);
        return;
    }

    /*
     * Karatsuba divide-and-conquer algorithm. We cut each input in
     * half, so that it's expressed as two big 'digits' in a giant
     * base D:
     *
     *   a = a_1 D + a_0
     *   b = b_1 D + b_0
     *
     * Then the product is of course
     *
     *   ab = a_1 b_1 D^2 + (a_1 b_0 + a_0 b_1) D + a_0 b_0
     *
     * and we compute the three coefficients by recursively calling
     * ourself to do half-length multiplications.
     *
     * The clever bit that makes this worth doing is that we only need
     * _one_ half-length multiplication for the central coefficient
     * rather than the two that it obviouly looks like, because we can
     * use a single multiplication to compute
     *
     *   (a_1 + a_0) (b_1 + b_0) = a_1 b_1 + a_1 b_0 + a_0 b_1 + a_0 b_0
     *
     * and then we subtract the other two coefficients (a_1 b_1 and
     * a_0 b_0) which we were computing anyway.
     *
     * Hence we get to multiply two numbers of length N in about three
     * times as much work as it takes to multiply numbers of length
     * N/2, which is obviously better than the four times as much work
     * it would take if we just did a long conventional multiply.
     */

    /* Break up the input as botlen + toplen, with botlen >= toplen.
     * The 'base' D is equal to 2^{botlen * BIGNUM_INT_BITS}. */
    size_t toplen = inlen / 2;
    size_t botlen = inlen - toplen;

    /* Alias bignums that address the two halves of a,b, and useful
     * pieces of r. */
    mp_int a0 = mp_make_alias(a, 0, botlen);
    mp_int b0 = mp_make_alias(b, 0, botlen);
    mp_int a1 = mp_make_alias(a, botlen, toplen);
    mp_int b1 = mp_make_alias(b, botlen, toplen);
    mp_int r0 = mp_make_alias(r, 0, botlen*2);
    mp_int r1 = mp_make_alias(r, botlen, r->nw);
    mp_int r2 = mp_make_alias(r, botlen*2, r->nw);

    /* Recurse to compute a0*b0 and a1*b1, in their correct positions
     * in the output bignum. They can't overlap. */
    mp_mul_internal(&r0, &a0, &b0, scratch);
    mp_mul_internal(&r2, &a1, &b1, scratch);

    if (r->nw < inlen*2) {
        /*
         * The output buffer isn't large enough to require the whole
         * product, so some of a1*b1 won't have been stored. In that
         * case we won't try to do the full Karatsuba optimisation;
         * we'll just recurse again to compute a0*b1 and a1*b0 - or at
         * least as much of them as the output buffer size requires -
         * and add each one in.
         */
        mp_int s = mp_alloc_from_scratch(
            &scratch, size_t_min(botlen+toplen, r1.nw));

        mp_mul_internal(&s, &a0, &b1, scratch);
        mp_add_into(&r1, &r1, &s);
        mp_mul_internal(&s, &a1, &b0, scratch);
        mp_add_into(&r1, &r1, &s);
        return;
    }

    /* a0+a1 and b0+b1 */
    mp_int asum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_int bsum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_add_into(&asum, &a0, &a1);
    mp_add_into(&bsum, &b0, &b1);

    /* Their product */
    mp_int product = mp_alloc_from_scratch(&scratch, botlen*2+1);
    mp_mul_internal(&product, &asum, &bsum, scratch);

    /* Subtract off the outer terms we already have */
    mp_sub_into(&product, &product, &r0);
    mp_sub_into(&product, &product, &r2);

    /* And add it in with the right offset. */
    mp_add_into(&r1, &r1, &product);
}